

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  void *__src;
  void *__dest;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  gost_pmeth_data *src_data;
  gost_pmeth_data *dst_data;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = pkey_gost_init((EVP_PKEY_CTX *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    __src = EVP_PKEY_CTX_get_data(in_RSI);
    __dest = EVP_PKEY_CTX_get_data(in_RDI);
    if ((__src == (void *)0x0) || (__dest == (void *)0x0)) {
      iVar1 = 0;
    }
    else {
      memcpy(__dest,__src,0x48);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int pkey_gost_copy(EVP_PKEY_CTX *dst, ossl3_const EVP_PKEY_CTX *src)
{
    struct gost_pmeth_data *dst_data, *src_data;
    if (!pkey_gost_init(dst)) {
        return 0;
    }
    src_data = EVP_PKEY_CTX_get_data(src);
    dst_data = EVP_PKEY_CTX_get_data(dst);
    if (!src_data || !dst_data)
        return 0;

    *dst_data = *src_data;

    return 1;
}